

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Mul::innerExtrema
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *param_1,Interval *xi,Interval *yi
          )

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  
  dVar1 = xi->m_lo;
  dVar2 = xi->m_hi;
  if ((-INFINITY < dVar1) || (NAN(dVar2))) {
    dVar4 = yi->m_lo;
    if ((!NAN(dVar1)) && (INFINITY <= dVar2)) goto LAB_0170fda9;
  }
  else {
    dVar4 = yi->m_lo;
LAB_0170fda9:
    if ((dVar4 <= 0.0) && (bVar3 = true, 0.0 <= yi->m_hi)) goto LAB_0170fe13;
  }
  if ((-INFINITY < dVar4) || (NAN(yi->m_hi))) {
    if (((dVar1 <= 0.0) && (!NAN(dVar4))) && (INFINITY <= yi->m_hi)) goto joined_r0x0170fe0f;
  }
  else if (dVar1 <= 0.0) {
joined_r0x0170fe0f:
    bVar3 = true;
    if (0.0 <= dVar2) goto LAB_0170fe13;
  }
  bVar3 = false;
LAB_0170fe13:
  __return_storage_ptr__->m_hasNaN = bVar3;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema(const EvalContext&, const Interval& xi, const Interval& yi) const
	{
		if (((xi.contains(-TCU_INFINITY) || xi.contains(TCU_INFINITY)) && yi.contains(0.0)) ||
			((yi.contains(-TCU_INFINITY) || yi.contains(TCU_INFINITY)) && xi.contains(0.0)))
			return Interval(TCU_NAN);

		return Interval();
	}